

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O2

void mean_double_suite::test_same(void)

{
  undefined8 local_40;
  undefined8 local_38;
  
  local_40 = 0x3ff0000000000000;
  local_38 = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x2d,"void mean_double_suite::test_same()",&local_40,&local_38);
  local_40 = 0x3ff0000000000000;
  local_38 = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x2f,"void mean_double_suite::test_same()",&local_40,&local_38);
  local_40 = 0x3ff0000000000000;
  local_38 = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x31,"void mean_double_suite::test_same()",&local_40,&local_38);
  return;
}

Assistant:

void test_same()
{
    decay::moment<double> filter(one_over_eight);
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
}